

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistogramClear(VP8LHistogram *p)

{
  int iVar1;
  uint32_t *puVar2;
  int iVar3;
  
  iVar1 = p->palette_code_bits_;
  puVar2 = p->literal_;
  iVar3 = (4 << ((byte)iVar1 & 0x1f)) + 0x1138;
  if (iVar1 < 1) {
    iVar3 = 0x1138;
  }
  memset(p,0,(long)iVar3);
  p->palette_code_bits_ = iVar1;
  p->literal_ = puVar2;
  return;
}

Assistant:

static void HistogramClear(VP8LHistogram* const p) {
  uint32_t* const literal = p->literal_;
  const int cache_bits = p->palette_code_bits_;
  const int histo_size = GetHistogramSize(cache_bits);
  memset(p, 0, histo_size);
  p->palette_code_bits_ = cache_bits;
  p->literal_ = literal;
}